

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

int IFN_Beginning_Of_Line(FORM *form)

{
  FIELD *pFVar1;
  char *pos;
  
  pFVar1 = form->current;
  Synchronize_Buffer(form);
  pos = Get_Start_Of_Data(form->current->buf + (long)form->currow * (long)form->current->dcols,
                          pFVar1->dcols);
  Adjust_Cursor_Position(form,pos);
  return 0;
}

Assistant:

static int IFN_Beginning_Of_Line(FORM * form)
{
  FIELD *field = form->current;

  Synchronize_Buffer(form);
  Adjust_Cursor_Position(form,
                 Get_Start_Of_Data(Address_Of_Current_Row_In_Buffer(form),
                                   field->dcols));
  return(E_OK);
}